

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

idx_t duckdb::BinaryExecutor::
      SelectFlatLoop<duckdb::interval_t,duckdb::interval_t,duckdb::Equals,false,true,true,false>
                (interval_t *ldata,interval_t *rdata,SelectionVector *sel,idx_t count,
                ValidityMask *validity_mask,SelectionVector *true_sel,SelectionVector *false_sel)

{
  int iVar1;
  unsigned_long *puVar2;
  sel_t *psVar3;
  sel_t *psVar4;
  ulong uVar5;
  int64_t *piVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  idx_t iVar12;
  unsigned_long uVar13;
  sel_t sVar14;
  long lVar15;
  
  if (count + 0x3f < 0x40) {
    iVar12 = 0;
  }
  else {
    puVar2 = (validity_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    iVar12 = 0;
    uVar7 = 0;
    uVar10 = 0;
    do {
      if (puVar2 == (unsigned_long *)0x0) {
        uVar13 = 0xffffffffffffffff;
      }
      else {
        uVar13 = puVar2[uVar7];
      }
      uVar8 = uVar10 + 0x40;
      if (count <= uVar10 + 0x40) {
        uVar8 = count;
      }
      uVar11 = uVar8;
      if (uVar13 != 0) {
        uVar11 = uVar10;
        if (uVar13 == 0xffffffffffffffff) {
          if (uVar10 < uVar8) {
            psVar3 = sel->sel_vector;
            iVar1 = rdata->months;
            psVar4 = true_sel->sel_vector;
            piVar6 = &ldata[uVar10].micros;
            do {
              uVar10 = uVar11;
              if (psVar3 != (sel_t *)0x0) {
                uVar10 = (ulong)psVar3[uVar11];
              }
              if (((((interval_t *)(piVar6 + -1))->months != iVar1) ||
                  (*(int32_t *)((long)piVar6 + -4) != rdata->days)) ||
                 (uVar5 = 1, *piVar6 != rdata->micros)) {
                lVar15 = (long)*(int32_t *)((long)piVar6 + -4) + *piVar6 / 86400000000;
                lVar9 = (long)rdata->days + rdata->micros / 86400000000;
                if ((long)((interval_t *)(piVar6 + -1))->months + lVar15 / 0x1e ==
                    (long)iVar1 + lVar9 / 0x1e) {
                  uVar5 = 0;
                  if (lVar15 % 0x1e == lVar9 % 0x1e) {
                    uVar5 = (ulong)(*piVar6 % 86400000000 == rdata->micros % 86400000000);
                  }
                }
                else {
                  uVar5 = 0;
                }
              }
              psVar4[iVar12] = (sel_t)uVar10;
              iVar12 = iVar12 + uVar5;
              uVar11 = uVar11 + 1;
              piVar6 = piVar6 + 2;
            } while (uVar8 != uVar11);
          }
        }
        else if (uVar10 < uVar8) {
          psVar3 = sel->sel_vector;
          psVar4 = true_sel->sel_vector;
          piVar6 = &ldata[uVar10].micros;
          uVar11 = 0;
          do {
            if (psVar3 == (sel_t *)0x0) {
              sVar14 = (int)uVar10 + (int)uVar11;
            }
            else {
              sVar14 = psVar3[uVar10 + uVar11];
            }
            if ((uVar13 >> (uVar11 & 0x3f) & 1) == 0) {
              uVar5 = 0;
            }
            else if (((((interval_t *)(piVar6 + -1))->months != rdata->months) ||
                     (*(int32_t *)((long)piVar6 + -4) != rdata->days)) ||
                    (uVar5 = 1, *piVar6 != rdata->micros)) {
              lVar9 = (long)*(int32_t *)((long)piVar6 + -4) + *piVar6 / 86400000000;
              lVar15 = (long)rdata->days + rdata->micros / 86400000000;
              if ((long)((interval_t *)(piVar6 + -1))->months + lVar9 / 0x1e ==
                  (long)rdata->months + lVar15 / 0x1e) {
                uVar5 = 0;
                if (lVar9 % 0x1e == lVar15 % 0x1e) {
                  uVar5 = (ulong)(*piVar6 % 86400000000 == rdata->micros % 86400000000);
                }
              }
              else {
                uVar5 = 0;
              }
            }
            psVar4[iVar12] = sVar14;
            iVar12 = uVar5 + iVar12;
            uVar11 = uVar11 + 1;
            piVar6 = piVar6 + 2;
          } while ((uVar10 - uVar8) + uVar11 != 0);
          uVar11 = uVar10 + uVar11;
        }
      }
      uVar7 = uVar7 + 1;
      uVar10 = uVar11;
    } while (uVar7 != count + 0x3f >> 6);
  }
  return iVar12;
}

Assistant:

static inline idx_t SelectFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                                   const SelectionVector *sel, idx_t count, ValidityMask &validity_mask,
	                                   SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		idx_t base_idx = 0;
		auto entry_count = ValidityMask::EntryCount(count);
		for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
			auto validity_entry = validity_mask.GetValidityEntry(entry_idx);
			idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
			if (ValidityMask::AllValid(validity_entry)) {
				// all valid: perform operation
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			} else if (ValidityMask::NoneValid(validity_entry)) {
				// nothing valid: skip all
				if (HAS_FALSE_SEL) {
					for (; base_idx < next; base_idx++) {
						idx_t result_idx = sel->get_index(base_idx);
						false_sel->set_index(false_count, result_idx);
						false_count++;
					}
				}
				base_idx = next;
				continue;
			} else {
				// partially valid: need to check individual elements for validity
				idx_t start = base_idx;
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = ValidityMask::RowIsValid(validity_entry, base_idx - start) &&
					                         OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}